

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

Entry * __thiscall Ptex::v2_4::PtexReader::MetaData::getEntry(MetaData *this,int index)

{
  size_t *psVar1;
  uint32_t uVar2;
  pointer ppEVar3;
  LargeMetaData *pLVar4;
  char *pcVar5;
  Entry *pEVar6;
  Mutex *__mutex;
  
  if ((index < 0) ||
     (ppEVar3 = (this->_entries).
                super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->_entries).
                         super__Vector_base<Ptex::v2_4::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_4::PtexReader::MetaData::Entry_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3) >> 3) <= index)
     ) {
    pEVar6 = (Entry *)0x0;
  }
  else {
    pEVar6 = ppEVar3[(uint)index];
    if ((pEVar6->isLmd == true) && (pEVar6->lmdData == (LargeMetaData *)0x0)) {
      __mutex = &this->_reader->readlock;
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (pEVar6->lmdData == (LargeMetaData *)0x0) {
        pLVar4 = (LargeMetaData *)operator_new(0x10);
        uVar2 = pEVar6->datasize;
        pLVar4->_vptr_LargeMetaData = (_func_int **)&PTR__LargeMetaData_0011d8a8;
        pcVar5 = (char *)operator_new__((long)(int)uVar2);
        pLVar4->_data = pcVar5;
        pEVar6->data = pcVar5;
        LOCK();
        psVar1 = &this->_reader->_memUsed;
        *psVar1 = *psVar1 + (ulong)pEVar6->datasize + 0x10;
        UNLOCK();
        seek(this->_reader,pEVar6->lmdPos);
        readZipBlock(this->_reader,pEVar6->data,pEVar6->lmdZipSize,pEVar6->datasize);
        pEVar6->lmdData = pLVar4;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
  }
  return pEVar6;
}

Assistant:

PtexReader::MetaData::Entry*
PtexReader::MetaData::getEntry(int index)
{
    if (index < 0 || index >= int(_entries.size())) {
        return 0;
    }

    Entry* e = _entries[index];
    if (!e->isLmd) {
        // normal (small) meta data - just return directly
        return e;
    }

    // large meta data - may not be read in yet
    if (e->lmdData) {
        // already in memory
        return e;
    }
    else {
        // not present, must read from file

        // get read lock and make sure we still need to read
        AutoMutex locker(_reader->readlock);
        if (e->lmdData) {
            return e;
        }
        // go ahead and read, keep local until finished
        LargeMetaData* lmdData = new LargeMetaData(e->datasize);
        e->data = (char*) lmdData->data();
        _reader->increaseMemUsed(sizeof(LargeMetaData) + e->datasize);
        _reader->seek(e->lmdPos);
        _reader->readZipBlock(e->data, e->lmdZipSize, e->datasize);
        // update entry
        e->lmdData = lmdData;
        return e;
    }
}